

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_heart_AST.h
# Opt level: O0

void __thiscall soul::heart::ProcessorInstance::~ProcessorInstance(ProcessorInstance *this)

{
  ProcessorInstance *this_local;
  
  (this->super_Object)._vptr_Object = (_func_int **)&PTR__ProcessorInstance_0058b5f8;
  std::__cxx11::string::~string((string *)&this->sourceName);
  std::__cxx11::string::~string((string *)&this->instanceName);
  Object::~Object(&this->super_Object);
  return;
}

Assistant:

ProcessorInstance (CodeLocation l) : Object (std::move (l)) {}